

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChDistribution.h
# Opt level: O3

void __thiscall chrono::ChNormalDistribution::~ChNormalDistribution(ChNormalDistribution *this)

{
  operator_delete(this,0x30);
  return;
}

Assistant:

class ChApi ChNormalDistribution : public ChDistribution {
  public:
    /// Create the normal distribution with assigned variance.
    /// The mean is 0 by default, but you can offset the curve if
    /// you want by providing a mean.
    ChNormalDistribution(double mvariance, double mmean = 0);

    /// Compute a random value whose probability density is the normal distribution.
    /// It uses the Box�Muller transform.
    virtual double GetRandom() override;

    double GetMean() const { return mean; }
    double GetVariance() const { return variance; }

  private:
    double mean;
    double variance;

    bool hasSpare;
    double rand1;
    double rand2;
}